

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O3

int dlep_extension_radio_write_session_init_ack
              (dlep_extension *ext,dlep_session *session,oonf_layer2_neigh_key *neigh)

{
  oonf_layer2_neighbor_index idx;
  oonf_layer2_network_index idx_00;
  int iVar1;
  int iVar2;
  oonf_layer2_net *poVar3;
  oonf_layer2_metadata *poVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  oonf_layer2_data *poVar8;
  ulong uVar9;
  
  poVar3 = oonf_layer2_net_add((session->l2_listener).name);
  if (poVar3 == (oonf_layer2_net *)0x0) {
    if (((&log_global_mask)[session->log_source] & 4) == 0) {
      return -1;
    }
    oonf_log(4,(ulong)session->log_source,"src/generic/dlep/dlep_extension.c",0x11f,0,0,
             "Could not add l2net for new interface");
    return -1;
  }
  uVar5 = ext->neigh_mapping_count;
  if (uVar5 != 0) {
    lVar7 = 0x18;
    uVar9 = 0;
    do {
      if (*(char *)((long)ext->neigh_mapping + lVar7 + -4) == '\x01') {
        idx = *(oonf_layer2_neighbor_index *)((long)ext->neigh_mapping + lVar7 + -8);
        poVar8 = poVar3->neighdata + idx;
        if ((poVar8->_origin == (oonf_layer2_origin *)0x0) ||
           (poVar8->_meta == (oonf_layer2_metadata *)0x0)) {
          poVar4 = oonf_layer2_neigh_metadata_get(idx);
          oonf_layer2_data_set
                    (poVar8,session->l2_default_origin,poVar4,
                     (oonf_layer2_value *)((long)&ext->neigh_mapping->dlep + lVar7));
          uVar5 = ext->neigh_mapping_count;
        }
      }
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x40;
    } while (uVar9 < uVar5);
  }
  uVar5 = ext->if_mapping_count;
  if (uVar5 != 0) {
    lVar7 = 0x18;
    uVar9 = 0;
    do {
      if (*(char *)((long)ext->if_mapping + lVar7 + -4) == '\x01') {
        idx_00 = *(oonf_layer2_network_index *)((long)ext->if_mapping + lVar7 + -8);
        poVar8 = poVar3->data + idx_00;
        if ((poVar8->_origin == (oonf_layer2_origin *)0x0) ||
           (poVar8->_meta == (oonf_layer2_metadata *)0x0)) {
          poVar4 = oonf_layer2_net_metadata_get(idx_00);
          oonf_layer2_data_set
                    (poVar8,session->l2_default_origin,poVar4,
                     (oonf_layer2_value *)((long)&ext->if_mapping->dlep + lVar7));
          uVar5 = ext->if_mapping_count;
        }
      }
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x40;
    } while (uVar9 < uVar5);
  }
  if (((&log_global_mask)[session->log_source] & 1) != 0) {
    oonf_log(1,(ulong)session->log_source,"src/generic/dlep/dlep_extension.c",0x142,0,0,
             "Mapping default neighbor data (%s) to TLVs",poVar3);
  }
  iVar2 = dlep_writer_map_l2neigh_data
                    (&session->writer,ext,poVar3->neighdata,(oonf_layer2_data *)0x0);
  uVar5 = (ulong)session->log_source;
  if (iVar2 == 0) {
    if (((&log_global_mask)[uVar5] & 1) != 0) {
      oonf_log(1,uVar5,"src/generic/dlep/dlep_extension.c",0x14a,0,0,"Mapping if data (%s) to TLVs",
               poVar3);
    }
    iVar2 = dlep_writer_map_l2net_data(&session->writer,ext,poVar3->data);
    if (iVar2 == 0) {
      return 0;
    }
    uVar5 = (ulong)session->log_source;
    if (((&log_global_mask)[uVar5] & 4) == 0) {
      return iVar2;
    }
    iVar1 = ext->id;
    uVar6 = 0x14d;
  }
  else {
    if (((&log_global_mask)[uVar5] & 4) == 0) {
      return iVar2;
    }
    iVar1 = ext->id;
    uVar6 = 0x145;
  }
  oonf_log(4,uVar5,"src/generic/dlep/dlep_extension.c",uVar6,0,0,
           "tlv mapping for extension %d failed: %d",iVar1,iVar2);
  return iVar2;
}

Assistant:

int
dlep_extension_radio_write_session_init_ack(
  struct dlep_extension *ext, struct dlep_session *session, const struct oonf_layer2_neigh_key *neigh __attribute__((unused))) {
  const struct oonf_layer2_metadata *meta;
  struct oonf_layer2_net *l2net;
  struct oonf_layer2_data *l2data;
  enum oonf_layer2_neighbor_index neigh_idx;
  enum oonf_layer2_network_index net_idx;
  size_t i;
  int result;

  /* first make sure defaults are set correctly */
  l2net = oonf_layer2_net_add(session->l2_listener.name);
  if (!l2net) {
    OONF_WARN(session->log_source, "Could not add l2net for new interface");
    return -1;
  }

  /* adding default neighbor data for mandatory values */
  for (i = 0; i < ext->neigh_mapping_count; i++) {
    if (!ext->neigh_mapping[i].mandatory) {
      continue;
    }

    neigh_idx = ext->neigh_mapping[i].layer2;
    l2data = &l2net->neighdata[neigh_idx];

    if (!oonf_layer2_data_has_value(l2data)) {
      meta = oonf_layer2_neigh_metadata_get(neigh_idx);
      oonf_layer2_data_set(l2data, session->l2_default_origin, meta, &ext->neigh_mapping[i].default_value);
    }
  }

  /* adding default interface data for mandatory values */
  for (i = 0; i < ext->if_mapping_count; i++) {
    if (!ext->if_mapping[i].mandatory) {
      continue;
    }

    net_idx = ext->if_mapping[i].layer2;
    l2data = &l2net->data[net_idx];

    if (!oonf_layer2_data_has_value(l2data)) {
      meta = oonf_layer2_net_metadata_get(net_idx);
      oonf_layer2_data_set(l2data, session->l2_default_origin, meta, &ext->if_mapping[i].default_value);
    }
  }

  /* write default metric values */
  OONF_DEBUG(session->log_source, "Mapping default neighbor data (%s) to TLVs", l2net->name);
  result = dlep_writer_map_l2neigh_data(&session->writer, ext, l2net->neighdata, NULL);
  if (result) {
    OONF_WARN(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return result;
  }

  /* write network wide data */
  OONF_DEBUG(session->log_source, "Mapping if data (%s) to TLVs", l2net->name);
  result = dlep_writer_map_l2net_data(&session->writer, ext, l2net->data);
  if (result) {
    OONF_WARN(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return result;
  }
  return 0;
}